

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

Statement *
slang::ast::ForLoopStatement::fromSyntax
          (Compilation *compilation,ForLoopStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  undefined8 uVar1;
  SourceRange sourceRange;
  sockaddr *psVar2;
  bool bVar3;
  int iVar4;
  SyntaxNode *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExpressionSyntax *pEVar6;
  undefined4 extraout_var_01;
  UnaryExpression *pUVar7;
  StatementSyntax *pSVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Expression **args_1;
  ForLoopStatement *this;
  undefined4 extraout_var_05;
  undefined8 in_RCX;
  sockaddr *in_RDX;
  EVP_PKEY_CTX *src;
  BumpAllocator *src_00;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *extraout_RDX;
  EVP_PKEY_CTX *src_01;
  long in_RSI;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_RDI;
  ForLoopStatement *result;
  Statement *bodyStmt;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  guard;
  bool wasFirst;
  UnaryOperator op;
  bool stepOk;
  Expression *expr;
  ExpressionSyntax *step;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SmallVector<const_slang::ast::Expression_*,_5UL> steps;
  Expression *stopExpr;
  Expression *init;
  SyntaxNode *initializer;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> *__range3_1;
  VariableSymbol *var;
  specific_symbol_iterator<slang::ast::VariableSymbol> __end3;
  specific_symbol_iterator<slang::ast::VariableSymbol> __begin3;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_(std::ranges::subrange_kind)0>
  *__range3;
  bool hasVarDecls;
  bool anyBad;
  SmallVector<const_slang::ast::VariableSymbol_*,_5UL> loopVars;
  SmallVector<const_slang::ast::Expression_*,_5UL> initializers;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  Compilation *in_stack_fffffffffffffbc0;
  span<const_slang::ast::VariableSymbol_*,_18446744073709551615UL> *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  ASTContext *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  SourceLocation in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffbf0;
  SyntaxNode *in_stack_fffffffffffffc10;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_2;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *args;
  BumpAllocator *this_00;
  bool local_391;
  bool local_286;
  bitmask<slang::ast::CompilationFlags> local_284;
  undefined8 local_280;
  pointer local_270;
  size_t sStack_268;
  SourceRange local_260;
  Expression **local_250;
  undefined8 local_240;
  ForLoopStatement *local_230;
  Statement *local_228;
  bitmask<slang::ast::StatementFlags> local_204;
  byte local_1fd;
  undefined4 local_1fc;
  SourceLocation local_1f8;
  SourceLocation SStack_1f0;
  undefined4 local_1e4;
  UnaryOperator local_1e0;
  bool local_1d9;
  Expression *local_1d8;
  bitmask<slang::ast::ASTFlags> local_1d0;
  Expression *local_1c8;
  ExpressionSyntax *local_1c0;
  const_iterator local_1b8;
  const_iterator local_1a8;
  long local_198;
  SmallVectorBase<const_slang::ast::Expression_*> local_190 [2];
  bitmask<slang::ast::ASTFlags> local_150;
  long local_148;
  undefined8 local_140;
  bitmask<slang::ast::ASTFlags> local_138;
  undefined8 local_130;
  SyntaxNode *local_128;
  const_iterator local_120;
  const_iterator local_110;
  long local_100;
  VariableSymbol *local_f8;
  VariableSymbol *local_f0;
  Symbol *local_e8;
  Symbol *local_e0;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_(std::ranges::subrange_kind)0>
  local_d8;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_(std::ranges::subrange_kind)0>
  *local_c8;
  bool local_aa;
  byte local_a9;
  ForLoopStatement *in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff70 [8];
  SmallVectorBase<const_slang::ast::Expression_*> local_68 [2];
  undefined8 local_28;
  sockaddr *local_20;
  long local_18;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *local_10;
  ForLoopStatement *local_8;
  undefined4 extraout_var_04;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xbd5534);
  SmallVector<const_slang::ast::VariableSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::VariableSymbol_*,_5UL> *)0xbd5541);
  local_a9 = 0;
  bVar3 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::empty
                    ((SeparatedSyntaxList<slang::syntax::SyntaxNode> *)0xbd555a);
  local_286 = false;
  if (!bVar3) {
    pSVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::operator[]
                       ((SeparatedSyntaxList<slang::syntax::SyntaxNode> *)in_stack_fffffffffffffbc0,
                        CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
    local_286 = pSVar5->kind == ForVariableDeclaration;
  }
  local_aa = local_286;
  if (local_286 == false) {
    local_100 = local_18 + 0x78;
    local_110 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::begin
                          ((SeparatedSyntaxList<slang::syntax::SyntaxNode> *)0xbd5753);
    local_120 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::end
                          ((SeparatedSyntaxList<slang::syntax::SyntaxNode> *)0xbd5792);
    while( true ) {
      bVar3 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>_>
                        ((self_type *)in_stack_fffffffffffffbc0,
                         (iterator_base<const_slang::syntax::SyntaxNode_*> *)
                         CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      local_128 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_false>
                               *)0xbd5801);
      pEVar6 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>(local_128);
      psVar2 = local_20;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_138,AssignmentAllowed);
      iVar4 = Expression::bind((int)pEVar6,psVar2,(socklen_t)local_138.m_bits);
      local_140 = CONCAT44(extraout_var,iVar4);
      local_130 = local_140;
      SmallVectorBase<const_slang::ast::Expression_*>::push_back
                ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffbc0,
                 (Expression **)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      bVar3 = Expression::bad((Expression *)in_stack_fffffffffffffbc0);
      local_a9 = (local_a9 & 1) != 0 || bVar3;
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_false>
                  *)in_stack_fffffffffffffbc0);
    }
  }
  else {
    not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0xbd55dc)
    ;
    local_d8 = Scope::membersOfType<slang::ast::VariableSymbol>
                         ((Scope *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    local_c8 = &local_d8;
    local_e0 = (Symbol *)
               std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_(std::ranges::subrange_kind)0>
               ::begin(local_c8);
    local_e8 = (Symbol *)
               std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_(std::ranges::subrange_kind)0>
               ::end(local_c8);
    while( true ) {
      bVar3 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_>
                        ((self_type *)in_stack_fffffffffffffbc0,
                         (specific_symbol_iterator<slang::ast::VariableSymbol> *)
                         CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      local_f8 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_false>
                 ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_false>
                              *)0xbd56bd);
      local_f0 = local_f8;
      SmallVectorBase<const_slang::ast::VariableSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::VariableSymbol_*> *)in_stack_fffffffffffffbc0,
                 (VariableSymbol **)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_false>
      ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_>
                ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_false>
                  *)in_stack_fffffffffffffbc0);
    }
  }
  psVar2 = local_20;
  local_148 = 0;
  if (*(long *)(local_18 + 0xc0) != 0) {
    uVar1 = *(undefined8 *)(local_18 + 0xc0);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_150,None);
    iVar4 = Expression::bind((int)uVar1,psVar2,(socklen_t)local_150.m_bits);
    local_148 = CONCAT44(extraout_var_00,iVar4);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xbd59a1);
  local_198 = local_18 + 0xd8;
  local_1a8 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xbd59c4);
  local_1b8 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xbd5a03);
  while( true ) {
    bVar3 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffbc0,
                       (iterator_base<const_slang::syntax::ExpressionSyntax_*> *)
                       CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    pEVar6 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                          *)0xbd5a72);
    psVar2 = local_20;
    local_1c0 = pEVar6;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_1d0,AssignmentAllowed);
    iVar4 = Expression::bind((int)pEVar6,psVar2,(socklen_t)local_1d0.m_bits);
    local_1d8 = (Expression *)CONCAT44(extraout_var_01,iVar4);
    local_1c8 = local_1d8;
    SmallVectorBase<const_slang::ast::Expression_*>::push_back
              ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffbc0,
               (Expression **)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
    bVar3 = Expression::bad((Expression *)in_stack_fffffffffffffbc0);
    local_a9 = local_a9 & 1 | bVar3;
    switch(local_1c8->kind) {
    case Invalid:
    case Assignment:
    case Call:
      local_1d9 = true;
      break;
    default:
      local_1d9 = false;
      break;
    case UnaryOp:
      pUVar7 = Expression::as<slang::ast::UnaryExpression>(local_1c8);
      local_1e0 = pUVar7->op;
      local_391 = true;
      if (((local_1e0 != Preincrement) && (local_391 = true, local_1e0 != Postincrement)) &&
         (local_391 = true, local_1e0 != Predecrement)) {
        local_391 = local_1e0 == Postdecrement;
      }
      local_1d9 = local_391;
    }
    if (local_1d9 == false) {
      local_a9 = 1;
      local_1e4 = 0x250008;
      local_1f8 = (local_1c8->sourceRange).startLoc;
      SStack_1f0 = (local_1c8->sourceRange).endLoc;
      sourceRange.startLoc._7_1_ = in_stack_fffffffffffffbe7;
      sourceRange.startLoc._0_7_ = in_stack_fffffffffffffbe0;
      sourceRange.endLoc = in_stack_fffffffffffffbe8;
      ASTContext::addDiag(in_stack_fffffffffffffbd8,
                          SUB84((ulong)in_stack_fffffffffffffbf0 >> 0x20,0),sourceRange);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                *)in_stack_fffffffffffffbc0);
  }
  if ((local_a9 & 1) == 0) {
    if (local_148 != 0) {
      bVar3 = Expression::bad((Expression *)in_stack_fffffffffffffbc0);
      if (bVar3) goto LAB_00bd5cda;
    }
    bitmask<slang::ast::StatementFlags>::bitmask(&local_204,InForLoop);
    bVar3 = bitmask<slang::ast::StatementFlags>::has
                      ((bitmask<slang::ast::StatementFlags> *)in_stack_fffffffffffffbc0,
                       (bitmask<slang::ast::StatementFlags> *)
                       CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
    local_1fd = !bVar3;
    Statement::StatementContext::enterLoop
              ((StatementContext *)in_stack_fffffffffffffbe8,(bool)in_stack_fffffffffffffbe7);
    pSVar8 = not_null<slang::syntax::StatementSyntax_*>::operator*
                       ((not_null<slang::syntax::StatementSyntax_*> *)0xbd5d91);
    iVar4 = Statement::bind((int)pSVar8,local_20,(socklen_t)local_28);
    local_228 = (Statement *)CONCAT44(extraout_var_02,iVar4);
    args = local_10;
    iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_68,(EVP_PKEY_CTX *)local_10,src);
    local_240 = CONCAT44(extraout_var_03,iVar4);
    this_00 = src_00;
    iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_190,(EVP_PKEY_CTX *)local_10,(EVP_PKEY_CTX *)src_00);
    args_1 = (Expression **)CONCAT44(extraout_var_04,iVar4);
    args_2 = extraout_RDX;
    local_250 = args_1;
    local_260 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc10);
    this = BumpAllocator::
           emplace<slang::ast::ForLoopStatement,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
                     (this_00,args,args_1,args_2,(Statement *)local_260.startLoc,
                      (SourceRange *)local_260.endLoc);
    local_230 = this;
    iVar4 = SmallVectorBase<const_slang::ast::VariableSymbol_*>::copy
                      ((SmallVectorBase<const_slang::ast::VariableSymbol_*> *)
                       &stack0xffffffffffffff58,(EVP_PKEY_CTX *)local_10,src_01);
    local_280 = CONCAT44(extraout_var_05,iVar4);
    std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>::
    span<const_slang::ast::VariableSymbol_*,_18446744073709551615UL>
              ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)
               CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               in_stack_fffffffffffffbc8);
    (local_230->loopVars)._M_ptr = local_270;
    (local_230->loopVars)._M_extent._M_extent_value = sStack_268;
    bVar3 = Statement::bad(local_228);
    if (bVar3) {
      local_8 = (ForLoopStatement *)
                Statement::badStmt(in_stack_fffffffffffffbc0,
                                   (Statement *)
                                   CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
    }
    else {
      if ((local_1fd & 1) != 0) {
        bitmask<slang::ast::CompilationFlags>::bitmask(&local_284,StrictDriverChecking);
        bVar3 = Compilation::hasFlag
                          ((Compilation *)
                           CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                           (bitmask<slang::ast::CompilationFlags>)
                           (underlying_type)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
        if (!bVar3) {
          in_stack_fffffffffffffbc0 =
               (Compilation *)
               not_null<const_slang::ast::Scope_*>::operator->
                         ((not_null<const_slang::ast::Scope_*> *)0xbd6017);
          bVar3 = Scope::isUninstantiated((Scope *)this);
          if (!bVar3) {
            UnrollVisitor::run((ASTContext *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          }
        }
      }
      local_8 = local_230;
    }
    local_1fc = 1;
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/Statement.h:162:37)>
    ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
                   *)in_stack_fffffffffffffbc0);
  }
  else {
LAB_00bd5cda:
    local_8 = (ForLoopStatement *)
              Statement::badStmt(in_stack_fffffffffffffbc0,
                                 (Statement *)
                                 CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
    local_1fc = 1;
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xbd6086);
  SmallVector<const_slang::ast::VariableSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::VariableSymbol_*,_5UL> *)0xbd6093);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xbd60a0);
  return &local_8->super_Statement;
}

Assistant:

Statement& ForLoopStatement::fromSyntax(Compilation& compilation,
                                        const ForLoopStatementSyntax& syntax,
                                        const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> initializers;
    SmallVector<const VariableSymbol*> loopVars;
    bool anyBad = false;

    const bool hasVarDecls = !syntax.initializers.empty() &&
                             syntax.initializers[0]->kind == SyntaxKind::ForVariableDeclaration;
    if (hasVarDecls) {
        // The block should have already been created for us containing the
        // variable declarations.
        for (auto& var : context.scope->membersOfType<VariableSymbol>())
            loopVars.push_back(&var);
    }
    else {
        for (auto initializer : syntax.initializers) {
            auto& init = Expression::bind(initializer->as<ExpressionSyntax>(), context,
                                          ASTFlags::AssignmentAllowed);
            initializers.push_back(&init);
            anyBad |= init.bad();
        }
    }

    const Expression* stopExpr = nullptr;
    if (syntax.stopExpr)
        stopExpr = &Expression::bind(*syntax.stopExpr, context);

    SmallVector<const Expression*> steps;
    for (auto step : syntax.steps) {
        auto& expr = Expression::bind(*step, context, ASTFlags::AssignmentAllowed);
        steps.push_back(&expr);
        anyBad |= expr.bad();

        bool stepOk;
        switch (expr.kind) {
            case ExpressionKind::Invalid:
            case ExpressionKind::Assignment:
            case ExpressionKind::Call:
                stepOk = true;
                break;
            case ExpressionKind::UnaryOp: {
                auto op = expr.as<UnaryExpression>().op;
                stepOk = op == UnaryOperator::Preincrement || op == UnaryOperator::Postincrement ||
                         op == UnaryOperator::Predecrement || op == UnaryOperator::Postdecrement;
                break;
            }
            default:
                stepOk = false;
                break;
        }

        if (!stepOk) {
            anyBad = true;
            context.addDiag(diag::InvalidForStepExpression, expr.sourceRange);
        }
    }

    if (anyBad || (stopExpr && stopExpr->bad()))
        return badStmt(compilation, nullptr);

    // For purposes of checking for multiple drivers to variables, we want to
    // "unroll" this for loop if possible to allow finer grained checking of
    // longest static prefixes involving the loop variables(s).
    const bool wasFirst = !stmtCtx.flags.has(StatementFlags::InForLoop);
    auto guard = stmtCtx.enterLoop(true);
    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);

    auto result = compilation.emplace<ForLoopStatement>(initializers.copy(compilation), stopExpr,
                                                        steps.copy(compilation), bodyStmt,
                                                        syntax.sourceRange());
    result->loopVars = loopVars.copy(compilation);

    if (bodyStmt.bad())
        return badStmt(compilation, result);

    // If this is the top-level unrollable for loop, attempt the unrolling now.
    // If not top-level, just pop up the stack and let the parent loop handle us.
    if (wasFirst && !compilation.hasFlag(CompilationFlags::StrictDriverChecking) &&
        !context.scope->isUninstantiated()) {
        UnrollVisitor::run(context, *result);
    }

    return *result;
}